

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqarray.h
# Opt level: O2

SQInteger __thiscall
SQArray::Next(SQArray *this,SQObjectPtr *refpos,SQObjectPtr *outkey,SQObjectPtr *outval)

{
  SQObjectPtr *pSVar1;
  SQUnsignedInteger x;
  SQSharedState **ppSVar2;
  SQInteger SVar3;
  SQSharedState *local_38;
  SQObjectValue SStack_30;
  
  x = TranslateIndex(refpos);
  if (x < (this->_values)._size) {
    SQObjectPtr::operator=(outkey,x);
    pSVar1 = (this->_values)._vals;
    ppSVar2 = (SQSharedState **)(pSVar1 + x);
    if (pSVar1[x].super_SQObject._type == OT_WEAKREF) {
      ppSVar2 = &((SQObjectValue *)(ppSVar2 + 1))->pString->_sharedstate;
    }
    local_38 = *ppSVar2;
    SStack_30 = *(SQObjectValue *)(ppSVar2 + 1);
    SQObjectPtr::operator=(outval,(SQObject *)&local_38);
    SVar3 = x + 1;
  }
  else {
    SVar3 = -1;
  }
  return SVar3;
}

Assistant:

SQInteger Next(const SQObjectPtr &refpos,SQObjectPtr &outkey,SQObjectPtr &outval)
    {
        SQUnsignedInteger idx=TranslateIndex(refpos);
        while(idx<_values.size()){
            //first found
            outkey=(SQInteger)idx;
            SQObjectPtr &o = _values[idx];
            outval = _realval(o);
            //return idx for the next iteration
            return ++idx;
        }
        //nothing to iterate anymore
        return -1;
    }